

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

bool libcellml::isNameChar(uint32_t nameChar)

{
  bool bVar1;
  bool local_12;
  bool local_11;
  bool local_9;
  uint32_t nameChar_local;
  
  bVar1 = isNameStartChar(nameChar);
  if (bVar1) {
    local_9 = true;
  }
  else {
    if ((((nameChar < 0x30) || (local_11 = true, 0x39 < nameChar)) &&
        (local_11 = true, nameChar != 0x2d)) &&
       (((local_11 = true, nameChar != 0x2e && (local_11 = true, nameChar != 0xc2b7)) &&
        ((nameChar < 0xcc80 || (local_11 = true, 0xcdaf < nameChar)))))) {
      local_12 = 0xe280be < nameChar && nameChar < 0xe28181;
      local_11 = local_12;
    }
    local_9 = local_11;
  }
  return local_9;
}

Assistant:

bool isNameChar(uint32_t nameChar)
{
    if (isNameStartChar(nameChar)) {
        return true;
    }

    // "-" | "." | [0-9] | #xB7 | [#x0300-#x036F] | [#x203F-#x2040]
    return ((0x30U <= nameChar) && (nameChar <= 0x39U))
           || (nameChar == 0x2DU)
           || (nameChar == 0x2EU)
           || (nameChar == 0xC2B7U)
           || ((0xCC80U <= nameChar) && (nameChar <= 0xCDAFU))
           || ((0xE280BFU <= nameChar) && (nameChar <= 0xE28180U));
}